

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O2

void __thiscall PcodeOpBank::clear(PcodeOpBank *this)

{
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *this_00;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *this_01;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *this_02;
  void *pvVar1;
  _List_node_base *p_Var2;
  
  this_00 = &this->alivelist;
  p_Var2 = (_List_node_base *)this_00;
  while (p_Var2 = (((_List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_> *)&p_Var2->_M_next)->_M_impl)
                  ._M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)this_00) {
    pvVar1 = p_Var2[1]._M_next;
    if (pvVar1 != (void *)0x0) {
      std::_Vector_base<Varnode_*,_std::allocator<Varnode_*>_>::~_Vector_base
                ((_Vector_base<Varnode_*,_std::allocator<Varnode_*>_> *)((long)pvVar1 + 0x50));
    }
    operator_delete(pvVar1);
  }
  this_01 = &this->deadlist;
  p_Var2 = (_List_node_base *)this_01;
  while (p_Var2 = (((_List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_> *)&p_Var2->_M_next)->_M_impl)
                  ._M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)this_01) {
    pvVar1 = p_Var2[1]._M_next;
    if (pvVar1 != (void *)0x0) {
      std::_Vector_base<Varnode_*,_std::allocator<Varnode_*>_>::~_Vector_base
                ((_Vector_base<Varnode_*,_std::allocator<Varnode_*>_> *)((long)pvVar1 + 0x50));
    }
    operator_delete(pvVar1);
  }
  this_02 = &this->deadandgone;
  p_Var2 = (_List_node_base *)this_02;
  while (p_Var2 = (((_List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_> *)&p_Var2->_M_next)->_M_impl)
                  ._M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)this_02) {
    pvVar1 = p_Var2[1]._M_next;
    if (pvVar1 != (void *)0x0) {
      std::_Vector_base<Varnode_*,_std::allocator<Varnode_*>_>::~_Vector_base
                ((_Vector_base<Varnode_*,_std::allocator<Varnode_*>_> *)((long)pvVar1 + 0x50));
    }
    operator_delete(pvVar1);
  }
  std::
  _Rb_tree<SeqNum,_std::pair<const_SeqNum,_PcodeOp_*>,_std::_Select1st<std::pair<const_SeqNum,_PcodeOp_*>_>,_std::less<SeqNum>,_std::allocator<std::pair<const_SeqNum,_PcodeOp_*>_>_>
  ::clear((_Rb_tree<SeqNum,_std::pair<const_SeqNum,_PcodeOp_*>,_std::_Select1st<std::pair<const_SeqNum,_PcodeOp_*>_>,_std::less<SeqNum>,_std::allocator<std::pair<const_SeqNum,_PcodeOp_*>_>_>
           *)this);
  std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::clear(this_00);
  std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::clear(this_01);
  clearCodeLists(this);
  std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::clear(this_02);
  this->uniqid = 0;
  return;
}

Assistant:

void PcodeOpBank::clear(void)

{
  list<PcodeOp *>::iterator iter;

  for(iter=alivelist.begin();iter!=alivelist.end();++iter)
    delete *iter;
  for(iter=deadlist.begin();iter!=deadlist.end();++iter)
    delete *iter;
  for(iter=deadandgone.begin();iter!=deadandgone.end();++iter)
    delete *iter;
  optree.clear();
  alivelist.clear();
  deadlist.clear();
  clearCodeLists();
  deadandgone.clear();
  uniqid = 0;
}